

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTcPrsOpBinGroup::find_and_apply_op(CTcPrsOpBinGroup *this,CTcPrsNode **lhs)

{
  tc_toktyp_t tVar1;
  tc_toktyp_t tVar2;
  long lVar3;
  long lVar4;
  long *in_RSI;
  CTcTokenizer *in_RDI;
  CTcPrsNode *const_tree;
  CTcPrsNode *rhs;
  CTcPrsOpBin **op;
  uint *local_20;
  
  local_20 = (uint *)in_RDI->default_mapper_;
  while( true ) {
    if (*(long *)local_20 == 0) {
      return 0;
    }
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x251cbf);
    tVar2 = CTcPrsOpBin::get_op_tok(*(CTcPrsOpBin **)local_20);
    if (tVar1 == tVar2) break;
    local_20 = local_20 + 2;
  }
  CTcTokenizer::next(in_RDI);
  lVar3 = (*(code *)**(undefined8 **)in_RDI->default_charset_)();
  if (lVar3 == 0) {
    *in_RSI = 0;
    return 0;
  }
  lVar4 = (**(code **)(**(long **)local_20 + 0x10))(*(long **)local_20,*in_RSI,lVar3);
  if (lVar4 == 0) {
    lVar3 = (**(code **)(**(long **)local_20 + 8))(*(long **)local_20,*in_RSI,lVar3);
    *in_RSI = lVar3;
  }
  else {
    *in_RSI = lVar4;
  }
  return 1;
}

Assistant:

int CTcPrsOpBinGroup::find_and_apply_op(CTcPrsNode **lhs) const
{
    /* check each operator at this precedence level */
    for (const CTcPrsOpBin *const *op = ops_ ; *op != 0 ; ++op)
    {
        /* check this operator's token */
        if (G_tok->cur() == (*op)->get_op_tok())
        {
            /* skip the operator token */
            G_tok->next();

            /* parse the right-hand side */
            CTcPrsNode *rhs = right_->parse();
            if (rhs == 0)
            {
                /* error - cancel the entire expression */
                *lhs = 0;
                return FALSE;
            }

            /* try folding our subnodes into a constant value */
            CTcPrsNode *const_tree = (*op)->eval_constant(*lhs, rhs);

            /* 
             *   if we couldn't calculate a constant value, build the tree
             *   normally 
             */
            if (const_tree == 0)
            {
                /* 
                 *   build my tree, replacing the original left-hand side
                 *   with the new expression 
                 */
                *lhs = (*op)->build_tree(*lhs, rhs);
            }
            else
            {
                /* we got a constant value - use it as the result */
                *lhs = const_tree;
            }

            /*
             *   Tell the caller to proceed to parse any additional
             *   occurrences of our operator - this will apply the next
             *   occurrence of the operator as the left-hand side of the
             *   new operator.  
             */
            return TRUE;
        }
    }

    /* 
     *   if we got here, we didn't find an operator - tell the caller that
     *   we've reached the end of this operator's possible span
     */
    return FALSE;
}